

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O0

idx_t duckdb::TernaryExecutor::
      Select<duckdb::string_t,_duckdb::string_t,_duckdb::string_t,_duckdb::UpperInclusiveBetweenOperator>
                (Vector *a,Vector *b,Vector *c,SelectionVector *sel,idx_t count,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  UnifiedVectorFormat *this;
  long in_RCX;
  UnifiedVectorFormat cdata;
  UnifiedVectorFormat bdata;
  UnifiedVectorFormat adata;
  SelectionVector *in_stack_fffffffffffffee0;
  idx_t in_stack_fffffffffffffee8;
  UnifiedVectorFormat *in_stack_fffffffffffffef0;
  UnifiedVectorFormat *in_stack_fffffffffffffef8;
  UnifiedVectorFormat *in_stack_ffffffffffffff00;
  UnifiedVectorFormat *in_stack_ffffffffffffff08;
  SelectionVector *in_stack_ffffffffffffff20;
  UnifiedVectorFormat *in_stack_ffffffffffffffa0;
  idx_t in_stack_ffffffffffffffa8;
  Vector *in_stack_ffffffffffffffb0;
  
  if (in_RCX == 0) {
    FlatVector::IncrementalSelectionVector();
  }
  UnifiedVectorFormat::UnifiedVectorFormat(in_stack_fffffffffffffef0);
  UnifiedVectorFormat::UnifiedVectorFormat(in_stack_fffffffffffffef0);
  UnifiedVectorFormat::UnifiedVectorFormat(in_stack_fffffffffffffef0);
  Vector::ToUnifiedFormat
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  Vector::ToUnifiedFormat
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  Vector::ToUnifiedFormat
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  this = (UnifiedVectorFormat *)
         SelectLoopSwitch<duckdb::string_t,_duckdb::string_t,_duckdb::string_t,_duckdb::UpperInclusiveBetweenOperator>
                   (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                    (SelectionVector *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                    in_stack_fffffffffffffee0,in_stack_ffffffffffffff20);
  UnifiedVectorFormat::~UnifiedVectorFormat(this);
  UnifiedVectorFormat::~UnifiedVectorFormat(this);
  UnifiedVectorFormat::~UnifiedVectorFormat(this);
  return (idx_t)this;
}

Assistant:

static idx_t Select(Vector &a, Vector &b, Vector &c, const SelectionVector *sel, idx_t count,
	                    SelectionVector *true_sel, SelectionVector *false_sel) {
		if (!sel) {
			sel = FlatVector::IncrementalSelectionVector();
		}
		UnifiedVectorFormat adata, bdata, cdata;
		a.ToUnifiedFormat(count, adata);
		b.ToUnifiedFormat(count, bdata);
		c.ToUnifiedFormat(count, cdata);

		return SelectLoopSwitch<A_TYPE, B_TYPE, C_TYPE, OP>(adata, bdata, cdata, sel, count, true_sel, false_sel);
	}